

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

bool __thiscall QHttp2Connection::readClientPreface(QHttp2Connection *this)

{
  int iVar1;
  QIODevice *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = getSocket(this);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  lVar3 = QIODevice::read((char *)pQVar2,(longlong)&local_28);
  if (lVar3 == 0x18) {
    iVar1 = bcmp(&local_28,Http2::Http2clientPreface,0x18);
    bVar4 = iVar1 == 0;
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::readClientPreface()
{
    auto *socket = getSocket();
    Q_ASSERT(socket->bytesAvailable() >= Http2::clientPrefaceLength);
    char buffer[Http2::clientPrefaceLength];
    const qint64 read = socket->read(buffer, Http2::clientPrefaceLength);
    if (read != Http2::clientPrefaceLength)
        return false;
    return memcmp(buffer, Http2::Http2clientPreface, Http2::clientPrefaceLength) == 0;
}